

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

CreatedTransactionResult *
wallet::FundTransaction
          (CreatedTransactionResult *__return_storage_ptr__,CWallet *wallet,CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          UniValue *options,CCoinControl *coinControl,bool override_min_fee)

{
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_> *this;
  pointer pUVar1;
  Descriptor *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  string *psVar11;
  optional<OutputType> oVar12;
  _Storage<CFeeRate,_true> _Var13;
  UniValue *pUVar14;
  UniValue *pUVar15;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar16;
  string *psVar17;
  long lVar18;
  T *pTVar19;
  char *estimate_mode;
  _Array_type *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  pointer pUVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  iterator __begin4;
  long *plVar23;
  pointer puVar24;
  pointer pcVar25;
  undefined **ppuVar26;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view strKey;
  string_view str;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  size_t i_2;
  size_t i;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  size_t i_12;
  Result<wallet::CreatedTransactionResult> txr;
  ulong local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_800;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_7c0;
  CCoinControl local_7a8;
  undefined1 local_5d8 [8];
  VectorFormatter<DefaultFormatter> *local_5d0;
  undefined1 local_5c8 [56];
  undefined1 local_590 [16];
  undefined1 local_580 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  vector<UniValue,_std::allocator<UniValue>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [32];
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  undefined1 auStack_470 [8];
  undefined1 local_468 [16];
  int local_458;
  undefined4 uStack_454;
  undefined1 local_450 [24];
  undefined1 auStack_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  undefined1 local_3e0 [8];
  undefined1 local_3d8 [40];
  pointer local_3b0;
  undefined1 local_3a8 [48];
  undefined1 local_378 [24];
  pointer local_360;
  undefined1 local_350 [24];
  undefined1 *local_338;
  undefined1 local_328 [16];
  undefined8 local_318;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined8 local_2f0;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined8 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined8 local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined8 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_478[0] = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  estimate_mode = "FundTransaction";
  inline_check_non_fatal<bool>
            ((bool *)local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/spend.cpp"
             ,0x1f8,"FundTransaction","tx.vout.empty()");
  CWallet::BlockUntilSyncedToCurrentChain(wallet);
  if (options->typ == VNULL) {
    bVar7 = ParseIncludeWatchonly(&NullUniValue,wallet);
LAB_00c98bc5:
    coinControl->fAllowWatchOnly = bVar7;
    local_800 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_808 = 0;
    bVar7 = false;
  }
  else {
    if (options->typ == VBOOL) {
      bVar7 = ::UniValue::get_bool(options);
      goto LAB_00c98bc5;
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
    local_458._0_1_ = false;
    local_458._1_3_ = 0;
    uStack_454 = VBOOL;
    local_450._0_8_ = (long)local_450 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"include_unsafe","");
    auStack_438._8_8_ = (pointer)0x500000000;
    local_428._0_8_ = local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"add_to_wallet","");
    local_408._0_8_ = (pointer)0x500000000;
    local_408._8_8_ = &local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_408 + 8),"changeAddress","");
    local_3e0 = (undefined1  [8])0x300000000;
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"change_address","");
    local_3d8._32_8_ = (pointer)0x300000000;
    local_3b0 = (pointer)(local_3a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"changePosition","");
    local_3a8._24_8_ = (pointer)0x400000000;
    local_3a8._32_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_3a8 + 0x20),"change_position","");
    local_378._16_8_ = (pointer)0x400000000;
    local_360 = (pointer)local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"change_type","");
    local_350._16_8_ = 0x300000000;
    local_338 = local_328;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"includeWatching","");
    local_318 = 0x500000000;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"include_watching","");
    local_2f0 = 0x500000000;
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"inputs","");
    local_2c8 = 0x200000000;
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"lockUnspents","");
    local_2a0 = 0x500000000;
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"lock_unspents","");
    local_278 = 0x500000000;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"locktime","");
    local_250 = 0x400000000;
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"fee_rate","");
    local_228 = 1;
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"feeRate","");
    local_200 = 1;
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"psbt","");
    local_1d8 = 0x500000000;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"solving_data","");
    local_1b0 = 0x100000000;
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"subtractFeeFromOutputs","")
    ;
    local_188 = 0x200000000;
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"subtract_fee_from_outputs","");
    local_160 = 0x200000000;
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"replaceable","");
    local_138 = 0x500000000;
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"conf_target","");
    local_110 = 0x400000000;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"estimate_mode","");
    local_e8 = 0x300000000;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"minconf","");
    local_c0 = 0x400000000;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"maxconf","");
    ppuVar26 = (undefined **)(auStack_470 + 8);
    local_98 = 0x400000000;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input_weights","");
    local_70 = 0x200000000;
    plVar23 = local_58;
    local_68[0] = plVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"max_tx_weight","");
    local_48 = 0x400000000;
    psVar17 = &local_498;
    __l._M_len = 0x1b;
    __l._M_array = (iterator)local_478;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
           *)local_590,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          local_5d8,(allocator_type *)psVar17);
    args = (_Array_type *)0x1;
    RPCTypeCheckObj(options,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                             *)local_590,true,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                 *)local_590);
    lVar18 = -0x438;
    do {
      if (plVar23 != (long *)plVar23[-2]) {
        operator_delete((long *)plVar23[-2],*plVar23 + 1);
      }
      plVar23 = plVar23 + -5;
      lVar18 = lVar18 + 0x28;
    } while (lVar18 != 0);
    local_478 = (undefined1  [8])ppuVar26;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
    bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
    if (local_478 != (undefined1  [8])ppuVar26) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar7) {
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_478);
      bVar7 = ::UniValue::get_bool(pUVar15);
      coinControl->m_allow_other_inputs = bVar7;
      if (local_478 != (undefined1  [8])ppuVar26) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
    }
    local_478 = (undefined1  [8])ppuVar26;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changeAddress","");
    bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
    bVar8 = true;
    if (!bVar7) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"change_address","");
      bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    if (local_478 != (undefined1  [8])ppuVar26) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8 != false) {
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_address","");
      bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_5d8);
      paVar20 = &local_498.field_2;
      local_498._M_dataplus._M_p = (pointer)paVar20;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"change_address","");
        pUVar15 = ::UniValue::operator[](options,&local_498);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"changeAddress","");
        pUVar15 = ::UniValue::operator[](options,&local_498);
      }
      psVar11 = ::UniValue::get_str_abi_cxx11_(pUVar15);
      pcVar25 = (psVar11->_M_dataplus)._M_p;
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_590,pcVar25,pcVar25 + psVar11->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != paVar20) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      DecodeDestination((CTxDestination *)local_478,(string *)local_590);
      bVar7 = IsValidDestination((CTxDestination *)local_478);
      if (!bVar7) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_5d8 = (undefined1  [8])local_5c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5d8,"Change address must be a valid bitcoin address","");
        JSONRPCError(pUVar15,-5,(string *)local_5d8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      args = &std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
              ::_S_vtable;
      local_5d8 = (undefined1  [8])coinControl;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
        ::_S_vtable._M_arr[(long)(char)auStack_438[8] + 1]._M_data)
                ((anon_class_8_1_8991fb9c_conflict4 *)local_5d8,
                 (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)local_478);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)local_478);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    ppuVar26 = (undefined **)(auStack_470 + 8);
    local_478 = (undefined1  [8])ppuVar26;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changePosition","");
    bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
    bVar8 = true;
    if (!bVar7) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"change_position","");
      bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    if (local_478 != (undefined1  [8])ppuVar26) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8 != false) {
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_position","");
      bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"change_position","");
        pUVar15 = ::UniValue::operator[](options,&local_4b8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"changePosition","");
        pUVar15 = ::UniValue::operator[](options,&local_4b8);
      }
      uVar10 = ::UniValue::getInt<int>(pUVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (local_478 != (undefined1  [8])ppuVar26) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (-1 < (int)uVar10) {
        local_800 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar10;
        args = (_Array_type *)
               (((long)(recipients->
                       super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(recipients->
                       super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        local_808 = 0x100000000;
        if (local_800 <= args) goto LAB_00c9969e;
      }
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"changePosition out of bounds","");
      JSONRPCError(pUVar15,-8,(string *)local_478);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00c9c60c;
    }
    local_800 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_808 = 0;
LAB_00c9969e:
    local_478 = (undefined1  [8])ppuVar26;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_type","");
    bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
    if (local_478 != (undefined1  [8])ppuVar26) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar7) {
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changeAddress","");
      bVar7 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
      bVar8 = true;
      if (!bVar7) {
        local_590._0_8_ = local_580;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"change_address","");
        bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
        if ((undefined1 *)local_590._0_8_ != local_580) {
          operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
        }
      }
      if (local_478 != (undefined1  [8])ppuVar26) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (bVar8 != false) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_478 = (undefined1  [8])ppuVar26;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_478,"Cannot specify both change address and address type options"
                   ,"");
        JSONRPCError(pUVar15,-8,(string *)local_478);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      local_478 = (undefined1  [8])ppuVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_type","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_478);
      psVar11 = ::UniValue::get_str_abi_cxx11_(pUVar15);
      oVar12 = ParseOutputType(psVar11);
      if (local_478 != (undefined1  [8])ppuVar26) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (((ulong)oVar12.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) == 0) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_590._0_8_ = local_580;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"change_type","");
        pUVar14 = ::UniValue::operator[](options,(string *)local_590);
        psVar17 = ::UniValue::get_str_abi_cxx11_(pUVar14);
        tinyformat::format<std::__cxx11::string>
                  ((string *)local_478,(tinyformat *)"Unknown change type \'%s\'",(char *)psVar17,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        JSONRPCError(pUVar15,-5,(string *)local_478);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType>._M_payload._M_value =
           oVar12.super__Optional_base<OutputType,_true,_true>._M_payload.
           super__Optional_payload_base<OutputType>._M_payload;
      (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType>._M_engaged = true;
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"include_watching","");
    bVar7 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    if (bVar7) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"include_watching","");
      pUVar15 = ::UniValue::operator[](options,&local_4d8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"includeWatching","");
      pUVar15 = ::UniValue::operator[](options,&local_4d8);
    }
    local_478._0_4_ = pUVar15->typ;
    pcVar25 = (pUVar15->val)._M_dataplus._M_p;
    auStack_470 = (undefined1  [8])(local_468 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_470,pcVar25,pcVar25 + (pUVar15->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_450,&pUVar15->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_438,&pUVar15->values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    bVar7 = ParseIncludeWatchonly((UniValue *)local_478,wallet);
    coinControl->fAllowWatchOnly = bVar7;
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"lockUnspents","");
    bVar7 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    bVar8 = true;
    if (!bVar7) {
      local_5d8 = (undefined1  [8])local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"lock_unspents","");
      bVar8 = ::UniValue::findKey(options,(string *)local_5d8,(size_t *)local_4f8);
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,CONCAT71(local_5c8._1_7_,local_5c8[0]) + 1);
      }
    }
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8 == false) {
      bVar7 = false;
    }
    else {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"lock_unspents","");
      bVar7 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      local_4f8._0_8_ = local_4f8 + 0x10;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"lock_unspents","");
        pUVar15 = ::UniValue::operator[](options,(string *)local_4f8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"lockUnspents","");
        pUVar15 = ::UniValue::operator[](options,(string *)local_4f8);
      }
      bVar7 = ::UniValue::get_bool(pUVar15);
      if ((_Base_ptr)local_4f8._0_8_ != (_Base_ptr)(local_4f8 + 0x10)) {
        operator_delete((void *)local_4f8._0_8_,(ulong)(local_4f8._16_8_ + 1));
      }
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"include_unsafe","");
    bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"include_unsafe","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_590);
      bVar8 = ::UniValue::get_bool(pUVar15);
      coinControl->m_include_unsafe_inputs = bVar8;
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"feeRate","");
    bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"fee_rate","");
      bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
      if (bVar8) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+(&local_538,"Cannot specify both fee_rate (",&::CURRENCY_ATOM_abi_cxx11_);
        pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_538,"/vB) and feeRate (");
        local_518._0_8_ = (pbVar22->_M_dataplus)._M_p;
        paVar20 = &pbVar22->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._0_8_ == paVar20) {
          local_508._0_8_ = paVar20->_M_allocated_capacity;
          local_508._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
          local_518._0_8_ = (_Base_ptr)local_508;
        }
        else {
          local_508._0_8_ = paVar20->_M_allocated_capacity;
        }
        local_518._8_8_ = pbVar22->_M_string_length;
        (pbVar22->_M_dataplus)._M_p = (pointer)paVar20;
        pbVar22->_M_string_length = 0;
        (pbVar22->field_2)._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,&::CURRENCY_UNIT_abi_cxx11_);
        pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5d8,"/kvB)");
        local_590._0_8_ = (pbVar22->_M_dataplus)._M_p;
        paVar20 = &pbVar22->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._0_8_ == paVar20) {
          local_580._0_8_ = paVar20->_M_allocated_capacity;
          local_580._8_8_ = *(long *)((long)&pbVar22->field_2 + 8);
          local_590._0_8_ = local_580;
        }
        else {
          local_580._0_8_ = paVar20->_M_allocated_capacity;
        }
        local_590._8_8_ = pbVar22->_M_string_length;
        (pbVar22->_M_dataplus)._M_p = (pointer)paVar20;
        pbVar22->_M_string_length = 0;
        (pbVar22->field_2)._M_local_buf[0] = '\0';
        JSONRPCError(pUVar15,-8,(string *)local_590);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"conf_target","");
      bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
      if (bVar8) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_590._0_8_ = local_580;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_590,
                   "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate."
                   ,"");
        JSONRPCError(pUVar15,-8,(string *)local_590);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"estimate_mode","");
      bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
      if (bVar8) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_590._0_8_ = local_580;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_590,"Cannot specify both estimate_mode and feeRate","");
        JSONRPCError(pUVar15,-8,(string *)local_590);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"feeRate","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_590);
      _Var13 = (_Storage<CFeeRate,_true>)AmountFromValue(pUVar15,8);
      if ((coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == false) {
        (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged = true;
      }
      (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload = _Var13;
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
      coinControl->fOverrideFeeRate = true;
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"replaceable","");
    bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"replaceable","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_590);
      bVar8 = ::UniValue::get_bool(pUVar15);
      (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(bVar8 | 0x100);
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
      }
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"minconf","");
    bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"minconf","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_590);
      iVar9 = ::UniValue::getInt<int>(pUVar15);
      coinControl->m_min_depth = iVar9;
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
        iVar9 = coinControl->m_min_depth;
      }
      if (iVar9 < 0) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_590._0_8_ = local_580;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"Negative minconf","");
        JSONRPCError(pUVar15,-8,(string *)local_590);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"maxconf","");
    bVar8 = ::UniValue::findKey(options,(string *)local_590,(size_t *)local_5d8);
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    if (bVar8) {
      local_590._0_8_ = local_580;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"maxconf","");
      pUVar15 = ::UniValue::operator[](options,(string *)local_590);
      iVar9 = ::UniValue::getInt<int>(pUVar15);
      coinControl->m_max_depth = iVar9;
      if ((undefined1 *)local_590._0_8_ != local_580) {
        operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
        iVar9 = coinControl->m_max_depth;
      }
      if (iVar9 < coinControl->m_min_depth) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<int,int>
                  ((string *)local_590,(tinyformat *)"maxconf can\'t be lower than minconf: %d < %d"
                   ,(char *)&coinControl->m_max_depth,&coinControl->m_min_depth,(int *)psVar17);
        JSONRPCError(pUVar15,-8,(string *)local_590);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00c9c60c;
      }
    }
    local_590._0_8_ = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"conf_target","");
    pUVar15 = ::UniValue::operator[](options,(string *)local_590);
    local_5d8 = (undefined1  [8])local_5c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"estimate_mode","");
    estimate_mode = (char *)::UniValue::operator[](options,(string *)local_5d8);
    local_518._0_8_ = (_Base_ptr)local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"fee_rate","");
    pUVar14 = ::UniValue::operator[](options,(string *)local_518);
    SetFeeEstimateMode(wallet,coinControl,pUVar15,(UniValue *)estimate_mode,pUVar14,override_min_fee
                      );
    if ((_Base_ptr)local_518._0_8_ != (_Base_ptr)local_508) {
      operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
    }
    if (local_5d8 != (undefined1  [8])local_5c8) {
      operator_delete((void *)local_5d8,CONCAT71(local_5c8._1_7_,local_5c8[0]) + 1);
    }
    if ((undefined1 *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_450);
    if (auStack_470 != (undefined1  [8])(local_468 + 8)) {
      operator_delete((void *)auStack_470,local_468._8_8_ + 1);
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"solving_data","");
  bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar8) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"solving_data","");
    pUVar15 = ::UniValue::operator[](options,(string *)local_478);
    pUVar15 = ::UniValue::get_obj(pUVar15);
    local_590._0_4_ = pUVar15->typ;
    local_590._8_8_ = local_580 + 8;
    pcVar25 = (pUVar15->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_590 + 8),pcVar25,pcVar25 + (pUVar15->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_568,&pUVar15->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_550,&pUVar15->values);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"pubkeys","");
    bVar8 = ::UniValue::findKey((UniValue *)local_590,(string *)local_478,(size_t *)local_5d8);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"pubkeys","");
      pUVar15 = ::UniValue::operator[]((UniValue *)local_590,(string *)local_478);
      pUVar15 = ::UniValue::get_array(pUVar15);
      pvVar16 = ::UniValue::getValues(pUVar15);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar21 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar1 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar21 != pUVar1) {
        this = &(coinControl->m_external_provider).pubkeys;
        estimate_mode = (char *)this;
        do {
          psVar17 = ::UniValue::get_str_abi_cxx11_(pUVar21);
          HexToPubKey((CPubKey *)local_5d8,psVar17);
          CPubKey::GetID((CKeyID *)local_478,(CPubKey *)local_5d8);
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
          ::_M_emplace_unique<CKeyID,CPubKey_const&>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                      *)this,(CKeyID *)local_478,(CPubKey *)local_5d8);
          WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_538,(CPubKey *)local_5d8);
          local_468._0_4_ = local_538.field_2._M_allocated_capacity._0_4_;
          local_478 = (undefined1  [8])local_538._M_dataplus._M_p;
          auStack_470 = (undefined1  [8])local_538._M_string_length;
          auStack_438[8] = '\x05';
          GetScriptForDestination((CScript *)local_518,(CTxDestination *)local_478);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_478);
          CScriptID::CScriptID((CScriptID *)local_478,(CScript *)local_518);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript_const&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&(coinControl->m_external_provider).scripts,(CScriptID *)local_478,
                     (CScript *)local_518);
          if (0x1c < (uint)local_508._12_4_) {
            free((void *)local_518._0_8_);
          }
          pUVar21 = pUVar21 + 1;
        } while (pUVar21 != pUVar1);
      }
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"scripts","");
    bVar8 = ::UniValue::findKey((UniValue *)local_590,(string *)local_478,(size_t *)local_5d8);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"scripts","");
      pUVar15 = ::UniValue::operator[]((UniValue *)local_590,(string *)local_478);
      pUVar15 = ::UniValue::get_array(pUVar15);
      pvVar16 = ::UniValue::getValues(pUVar15);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar21 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar1 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar21 != pUVar1) {
        do {
          psVar17 = ::UniValue::get_str_abi_cxx11_(pUVar21);
          str._M_str = (psVar17->_M_dataplus)._M_p;
          str._M_len = psVar17->_M_string_length;
          bVar8 = IsHex(str);
          if (!bVar8) {
            pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_478,(tinyformat *)0x111954f,(char *)psVar17,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       estimate_mode);
            JSONRPCError(pUVar15,-5,(string *)local_478);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_00c9c60c;
          }
          hex_str._M_str = (psVar17->_M_dataplus)._M_p;
          hex_str._M_len = psVar17->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5d8,hex_str);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_5d8,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_5d0);
          CScriptID::CScriptID((CScriptID *)local_518,(CScript *)local_478);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript_const&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&(coinControl->m_external_provider).scripts,(CScriptID *)local_518,
                     (CScript *)local_478);
          if (0x1c < (uint)local_468._12_4_) {
            free((void *)local_478);
          }
          if (local_5d8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_5d8,
                            CONCAT71(local_5c8._1_7_,local_5c8[0]) - (long)local_5d8);
          }
          pUVar21 = pUVar21 + 1;
        } while (pUVar21 != pUVar1);
      }
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"descriptors","");
    bVar8 = ::UniValue::findKey((UniValue *)local_590,(string *)local_478,(size_t *)local_5d8);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"descriptors","");
      pUVar15 = ::UniValue::operator[]((UniValue *)local_590,(string *)local_478);
      pUVar15 = ::UniValue::get_array(pUVar15);
      pvVar16 = ::UniValue::getValues(pUVar15);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar21 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar1 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar21 != pUVar1) {
        do {
          psVar17 = ::UniValue::get_str_abi_cxx11_(pUVar21);
          local_478 = (undefined1  [8])&PTR__FlatSigningProvider_01399da8;
          local_468._0_8_ = local_468._0_8_ & 0xffffffff00000000;
          local_468._8_8_ = 0;
          _local_458 = (long)auStack_470 + 8;
          local_450._8_8_ = 0;
          auStack_438._0_8_ = auStack_438._0_8_ & 0xffffffff00000000;
          auStack_438._8_8_ = (pointer)0x0;
          local_428._0_8_ = auStack_438;
          local_418._0_8_ = (_Base_ptr)0x0;
          local_408._0_8_ = local_408._0_8_ & 0xffffffff00000000;
          local_408._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_408._16_8_ = local_408;
          local_3f0._8_8_ = 0;
          local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffff00000000;
          local_3d8._8_8_ = (_Base_ptr)0x0;
          local_3d8._16_8_ = local_3d8;
          local_3d8._32_8_ = (pointer)0x0;
          local_3a8._0_4_ = _S_red;
          local_3a8._8_8_ = (_Base_ptr)0x0;
          local_3a8._16_8_ = local_3a8;
          local_3a8._32_8_ = (pointer)0x0;
          local_5d8 = (undefined1  [8])local_5c8;
          local_5d0 = (VectorFormatter<DefaultFormatter> *)0x0;
          local_5c8[0] = '\0';
          local_538.field_2._M_allocated_capacity = 0;
          local_538._M_dataplus._M_p = (pointer)0x0;
          local_538._M_string_length = 0;
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          local_450._0_8_ = _local_458;
          local_428._8_8_ = local_428._0_8_;
          local_3f0._M_allocated_capacity = local_408._16_8_;
          local_3d8._24_8_ = local_3d8._16_8_;
          local_3a8._24_8_ = local_3a8._16_8_;
          Parse(&local_7c0,psVar17,(FlatSigningProvider *)local_478,(string *)local_5d8,true);
          puVar4 = local_7c0.
                   super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar24 = local_7c0.
                    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_7c0.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_7c0.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_518,(tinyformat *)"Unable to parse descriptor \'%s\': %s",
                       (char *)psVar17,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d8,pbVar22);
            JSONRPCError(pUVar15,-8,(string *)local_518);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_00c9c60c;
          }
          do {
            pDVar2 = (puVar24->_M_t).
                     super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                     super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                     super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
            (*pDVar2->_vptr_Descriptor[8])
                      (pDVar2,0,(FlatSigningProvider *)local_478,&local_538,
                       (FlatSigningProvider *)local_478,0);
            puVar24 = puVar24 + 1;
          } while (puVar24 != puVar4);
          FlatSigningProvider::Merge
                    (&coinControl->m_external_provider,(FlatSigningProvider *)local_478);
          std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::~vector(&local_7c0);
          std::vector<CScript,_std::allocator<CScript>_>::~vector
                    ((vector<CScript,_std::allocator<CScript>_> *)&local_538);
          if (local_5d8 != (undefined1  [8])local_5c8) {
            operator_delete((void *)local_5d8,CONCAT71(local_5c8._1_7_,local_5c8[0]) + 1);
          }
          std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::~_Rb_tree((_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                       *)&local_3b0);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                       *)local_3e0);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                       *)(local_418 + 8));
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                       *)(local_450 + 0x10));
          std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                       *)auStack_470);
          pUVar21 = pUVar21 + 1;
        } while (pUVar21 != pUVar1);
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_568);
    if ((undefined1 *)local_590._8_8_ != local_580 + 8) {
      operator_delete((void *)local_590._8_8_,(ulong)(local_580._8_8_ + 1));
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"input_weights","");
  bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar8) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"input_weights","");
    pUVar15 = ::UniValue::operator[](options,(string *)local_478);
    pUVar15 = ::UniValue::get_array(pUVar15);
    pvVar16 = ::UniValue::getValues(pUVar15);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    pUVar21 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar1 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pUVar21 != pUVar1) {
      do {
        strKey._M_str = "txid";
        strKey._M_len = 4;
        ParseHashO((uint256 *)local_590,pUVar21,strKey);
        key._M_str = "vout";
        key._M_len = 4;
        pUVar15 = ::UniValue::find_value(pUVar21,key);
        if (pUVar15->typ != VNUM) {
          pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, missing vout key","");
          JSONRPCError(pUVar15,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_00c9c60c;
        }
        iVar9 = ::UniValue::getInt<int>(pUVar15);
        if (iVar9 < 0) {
          pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, vout cannot be negative","");
          JSONRPCError(pUVar15,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_00c9c60c;
        }
        key_00._M_str = "weight";
        key_00._M_len = 6;
        pUVar15 = ::UniValue::find_value(pUVar21,key_00);
        if (pUVar15->typ != VNUM) {
          pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, missing weight key","");
          JSONRPCError(pUVar15,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_00c9c60c;
        }
        lVar18 = ::UniValue::getInt<long>(pUVar15);
        local_468._0_8_ = 0;
        local_468._8_8_ = 0;
        local_478 = (undefined1  [8])0x0;
        auStack_470 = (undefined1  [8])0x0;
        local_458 = 0xffffffff;
        local_450._16_8_ = 0;
        auStack_438._0_8_ = 0;
        local_450[0] = false;
        local_450._1_3_ = 0;
        local_450._4_4_ = VNULL;
        local_450._8_8_ = 0;
        local_428._0_8_ = (pointer)0x0;
        local_428._8_8_ = (pointer)0x0;
        local_418._0_8_ = (_Base_ptr)0x0;
        auStack_438._8_4_ = 0xffffffff;
        local_5d8 = (undefined1  [8])&::TX_NO_WITNESS;
        local_518._0_8_ = (_Base_ptr)0x24;
        local_5d0 = (VectorFormatter<DefaultFormatter> *)local_518;
        SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_5d8,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_450);
        *(long *)local_5d0 = *(long *)local_5d0 + 4;
        uVar5 = local_518._0_8_;
        local_5d8 = (undefined1  [8])&::TX_WITH_WITNESS;
        local_518._0_8_ = (_Base_ptr)0x24;
        local_5d0 = (VectorFormatter<DefaultFormatter> *)local_518;
        SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_5d8,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_450);
        *(long *)local_5d0 = *(long *)local_5d0 + 4;
        uVar6 = local_518._0_8_;
        local_5d8 = (undefined1  [8])0x0;
        VectorFormatter<DefaultFormatter>::
        Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)local_518,(SizeComputer *)local_5d8,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_428);
        pcVar25 = (pointer)(uVar6 + uVar5 * 3) + (long)local_5d8;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_428);
        if (0x1c < (uint)auStack_438._4_4_) {
          free((void *)local_450._0_8_);
        }
        local_478[0] = pcVar25 == (pointer)0xa5;
        inline_check_non_fatal<bool>
                  ((bool *)local_478,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/spend.cpp"
                   ,0x2b7,"FundTransaction","min_input_weight == 165");
        if (lVar18 < (long)pcVar25) {
          pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,
                     "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)"
                     ,"");
          JSONRPCError(pUVar15,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_00c9c60c;
        }
        if (400000 < lVar18) {
          pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
          tinyformat::format<int>
                    ((string *)local_478,
                     "Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d"
                     ,&MAX_STANDARD_TX_WEIGHT);
          JSONRPCError(pUVar15,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_00c9c60c;
        }
        local_468._0_8_ = local_580._0_8_;
        local_468._8_8_ = local_580._8_8_;
        local_478 = (undefined1  [8])local_590._0_8_;
        auStack_470 = (undefined1  [8])local_590._8_8_;
        local_458 = iVar9;
        CCoinControl::SetInputWeight(coinControl,(COutPoint *)local_478,lVar18);
        pUVar21 = pUVar21 + 1;
      } while (pUVar21 != pUVar1);
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"max_tx_weight","");
  bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_590);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar8) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"max_tx_weight","");
    pUVar15 = ::UniValue::operator[](options,(string *)local_478);
    uVar10 = ::UniValue::getInt<int>(pUVar15);
    (coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = (_Optional_payload_base<int>)((ulong)uVar10 | 0x100000000);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
  }
  if ((recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"TX must have at least one output","");
    JSONRPCError(pUVar15,-8,(string *)local_478);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_7a8,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)coinControl);
    local_7a8.m_min_depth = coinControl->m_min_depth;
    local_7a8.m_max_depth = coinControl->m_max_depth;
    local_7a8.m_change_type.super__Optional_base<OutputType,_true,_true>._M_payload.
    super__Optional_payload_base<OutputType> =
         *(_Optional_base<OutputType,_true,_true> *)
          &(coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
           super__Optional_payload_base<OutputType>;
    local_7a8.m_include_unsafe_inputs = coinControl->m_include_unsafe_inputs;
    local_7a8.m_allow_other_inputs = coinControl->m_allow_other_inputs;
    local_7a8.fAllowWatchOnly = coinControl->fAllowWatchOnly;
    local_7a8.fOverrideFeeRate = coinControl->fOverrideFeeRate;
    local_7a8._92_4_ = *(undefined4 *)&coinControl->field_0x5c;
    local_7a8.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload =
         (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
         super__Optional_payload_base<CFeeRate>._M_payload;
    local_7a8.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged =
         (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
         super__Optional_payload_base<CFeeRate>._M_engaged;
    local_7a8.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ =
         *(undefined7 *)
          &(coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
           super__Optional_payload_base<CFeeRate>.field_0x9;
    local_7a8.m_confirm_target.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>._M_payload
           .super__Optional_payload_base<unsigned_int>;
    local_7a8.m_signal_bip125_rbf.super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>;
    local_7a8.m_avoid_partial_spends = coinControl->m_avoid_partial_spends;
    local_7a8.m_avoid_address_reuse = coinControl->m_avoid_address_reuse;
    local_7a8.m_fee_mode = coinControl->m_fee_mode;
    FlatSigningProvider::FlatSigningProvider
              (&local_7a8.m_external_provider,&coinControl->m_external_provider);
    local_7a8.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         *(_Optional_base<int,_true,_true> *)
          &(coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
    local_7a8.m_locktime.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
    local_7a8.m_version.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::_Rb_tree(&local_7a8.m_selected._M_t,&(coinControl->m_selected)._M_t);
    local_7a8.m_selection_pos = coinControl->m_selection_pos;
    FundTransaction((Result<wallet::CreatedTransactionResult> *)local_478,wallet,tx,recipients,
                    (optional<unsigned_int>)(local_808 | (ulong)local_800),bVar7,&local_7a8);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::~_Rb_tree(&local_7a8.m_selected._M_t);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_7a8.m_external_provider.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_7a8.m_external_provider.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_7a8.m_external_provider.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_7a8.m_external_provider.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_7a8.m_external_provider.scripts._M_t);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_7a8);
    if (local_3d8[0] == (string)0x1) {
      pTVar19 = util::Result<wallet::CreatedTransactionResult>::value
                          ((Result<wallet::CreatedTransactionResult> *)local_478);
      (__return_storage_ptr__->tx).
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pTVar19->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (pTVar19->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (__return_storage_ptr__->tx).
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      memcpy(&__return_storage_ptr__->fee,&pTVar19->fee,0x90);
      std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                 local_478);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>
                ((bilingual_str *)local_590,(Result<wallet::CreatedTransactionResult> *)local_478);
      JSONRPCError(pUVar15,-4,(string *)local_590);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
    }
  }
LAB_00c9c60c:
  __stack_chk_fail();
}

Assistant:

CreatedTransactionResult FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& recipients, const UniValue& options, CCoinControl& coinControl, bool override_min_fee)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    CHECK_NONFATAL(tx.vout.empty());
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    std::optional<unsigned int> change_position;
    bool lockUnspents = false;
    if (!options.isNull()) {
      if (options.type() == UniValue::VBOOL) {
        // backward compatibility bool only fallback
        coinControl.fAllowWatchOnly = options.get_bool();
      }
      else {
        RPCTypeCheckObj(options,
            {
                {"add_inputs", UniValueType(UniValue::VBOOL)},
                {"include_unsafe", UniValueType(UniValue::VBOOL)},
                {"add_to_wallet", UniValueType(UniValue::VBOOL)},
                {"changeAddress", UniValueType(UniValue::VSTR)},
                {"change_address", UniValueType(UniValue::VSTR)},
                {"changePosition", UniValueType(UniValue::VNUM)},
                {"change_position", UniValueType(UniValue::VNUM)},
                {"change_type", UniValueType(UniValue::VSTR)},
                {"includeWatching", UniValueType(UniValue::VBOOL)},
                {"include_watching", UniValueType(UniValue::VBOOL)},
                {"inputs", UniValueType(UniValue::VARR)},
                {"lockUnspents", UniValueType(UniValue::VBOOL)},
                {"lock_unspents", UniValueType(UniValue::VBOOL)},
                {"locktime", UniValueType(UniValue::VNUM)},
                {"fee_rate", UniValueType()}, // will be checked by AmountFromValue() in SetFeeEstimateMode()
                {"feeRate", UniValueType()}, // will be checked by AmountFromValue() below
                {"psbt", UniValueType(UniValue::VBOOL)},
                {"solving_data", UniValueType(UniValue::VOBJ)},
                {"subtractFeeFromOutputs", UniValueType(UniValue::VARR)},
                {"subtract_fee_from_outputs", UniValueType(UniValue::VARR)},
                {"replaceable", UniValueType(UniValue::VBOOL)},
                {"conf_target", UniValueType(UniValue::VNUM)},
                {"estimate_mode", UniValueType(UniValue::VSTR)},
                {"minconf", UniValueType(UniValue::VNUM)},
                {"maxconf", UniValueType(UniValue::VNUM)},
                {"input_weights", UniValueType(UniValue::VARR)},
                {"max_tx_weight", UniValueType(UniValue::VNUM)},
            },
            true, true);

        if (options.exists("add_inputs")) {
            coinControl.m_allow_other_inputs = options["add_inputs"].get_bool();
        }

        if (options.exists("changeAddress") || options.exists("change_address")) {
            const std::string change_address_str = (options.exists("change_address") ? options["change_address"] : options["changeAddress"]).get_str();
            CTxDestination dest = DecodeDestination(change_address_str);

            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Change address must be a valid bitcoin address");
            }

            coinControl.destChange = dest;
        }

        if (options.exists("changePosition") || options.exists("change_position")) {
            int pos = (options.exists("change_position") ? options["change_position"] : options["changePosition"]).getInt<int>();
            if (pos < 0 || (unsigned int)pos > recipients.size()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "changePosition out of bounds");
            }
            change_position = (unsigned int)pos;
        }

        if (options.exists("change_type")) {
            if (options.exists("changeAddress") || options.exists("change_address")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both change address and address type options");
            }
            if (std::optional<OutputType> parsed = ParseOutputType(options["change_type"].get_str())) {
                coinControl.m_change_type.emplace(parsed.value());
            } else {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown change type '%s'", options["change_type"].get_str()));
            }
        }

        const UniValue include_watching_option = options.exists("include_watching") ? options["include_watching"] : options["includeWatching"];
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(include_watching_option, wallet);

        if (options.exists("lockUnspents") || options.exists("lock_unspents")) {
            lockUnspents = (options.exists("lock_unspents") ? options["lock_unspents"] : options["lockUnspents"]).get_bool();
        }

        if (options.exists("include_unsafe")) {
            coinControl.m_include_unsafe_inputs = options["include_unsafe"].get_bool();
        }

        if (options.exists("feeRate")) {
            if (options.exists("fee_rate")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both fee_rate (" + CURRENCY_ATOM + "/vB) and feeRate (" + CURRENCY_UNIT + "/kvB)");
            }
            if (options.exists("conf_target")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
            }
            if (options.exists("estimate_mode")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and feeRate");
            }
            coinControl.m_feerate = CFeeRate(AmountFromValue(options["feeRate"]));
            coinControl.fOverrideFeeRate = true;
        }

        if (options.exists("replaceable")) {
            coinControl.m_signal_bip125_rbf = options["replaceable"].get_bool();
        }

        if (options.exists("minconf")) {
            coinControl.m_min_depth = options["minconf"].getInt<int>();

            if (coinControl.m_min_depth < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative minconf");
            }
        }

        if (options.exists("maxconf")) {
            coinControl.m_max_depth = options["maxconf"].getInt<int>();

            if (coinControl.m_max_depth < coinControl.m_min_depth) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("maxconf can't be lower than minconf: %d < %d", coinControl.m_max_depth, coinControl.m_min_depth));
            }
        }
        SetFeeEstimateMode(wallet, coinControl, options["conf_target"], options["estimate_mode"], options["fee_rate"], override_min_fee);
      }
    } else {
        // if options is null and not a bool
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(NullUniValue, wallet);
    }

    if (options.exists("solving_data")) {
        const UniValue solving_data = options["solving_data"].get_obj();
        if (solving_data.exists("pubkeys")) {
            for (const UniValue& pk_univ : solving_data["pubkeys"].get_array().getValues()) {
                const CPubKey pubkey = HexToPubKey(pk_univ.get_str());
                coinControl.m_external_provider.pubkeys.emplace(pubkey.GetID(), pubkey);
                // Add witness script for pubkeys
                const CScript wit_script = GetScriptForDestination(WitnessV0KeyHash(pubkey));
                coinControl.m_external_provider.scripts.emplace(CScriptID(wit_script), wit_script);
            }
        }

        if (solving_data.exists("scripts")) {
            for (const UniValue& script_univ : solving_data["scripts"].get_array().getValues()) {
                const std::string& script_str = script_univ.get_str();
                if (!IsHex(script_str)) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' is not hex", script_str));
                }
                std::vector<unsigned char> script_data(ParseHex(script_str));
                const CScript script(script_data.begin(), script_data.end());
                coinControl.m_external_provider.scripts.emplace(CScriptID(script), script);
            }
        }

        if (solving_data.exists("descriptors")) {
            for (const UniValue& desc_univ : solving_data["descriptors"].get_array().getValues()) {
                const std::string& desc_str  = desc_univ.get_str();
                FlatSigningProvider desc_out;
                std::string error;
                std::vector<CScript> scripts_temp;
                auto descs = Parse(desc_str, desc_out, error, true);
                if (descs.empty()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unable to parse descriptor '%s': %s", desc_str, error));
                }
                for (auto& desc : descs) {
                    desc->Expand(0, desc_out, scripts_temp, desc_out);
                }
                coinControl.m_external_provider.Merge(std::move(desc_out));
            }
        }
    }

    if (options.exists("input_weights")) {
        for (const UniValue& input : options["input_weights"].get_array().getValues()) {
            Txid txid = Txid::FromUint256(ParseHashO(input, "txid"));

            const UniValue& vout_v = input.find_value("vout");
            if (!vout_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
            }
            int vout = vout_v.getInt<int>();
            if (vout < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
            }

            const UniValue& weight_v = input.find_value("weight");
            if (!weight_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing weight key");
            }
            int64_t weight = weight_v.getInt<int64_t>();
            const int64_t min_input_weight = GetTransactionInputWeight(CTxIn());
            CHECK_NONFATAL(min_input_weight == 165);
            if (weight < min_input_weight) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)");
            }
            if (weight > MAX_STANDARD_TX_WEIGHT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d", MAX_STANDARD_TX_WEIGHT));
            }

            coinControl.SetInputWeight(COutPoint(txid, vout), weight);
        }
    }

    if (options.exists("max_tx_weight")) {
        coinControl.m_max_tx_weight = options["max_tx_weight"].getInt<int>();
    }

    if (recipients.empty())
        throw JSONRPCError(RPC_INVALID_PARAMETER, "TX must have at least one output");

    auto txr = FundTransaction(wallet, tx, recipients, change_position, lockUnspents, coinControl);
    if (!txr) {
        throw JSONRPCError(RPC_WALLET_ERROR, ErrorString(txr).original);
    }
    return *txr;
}